

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Connection::ReadCSV
          (Connection *this,string *csv_file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *columns)

{
  pointer pCVar1;
  bool bVar2;
  bool bVar3;
  idx_t iVar4;
  pointer pbVar5;
  ParserOptions options_00;
  size_type sVar6;
  element_type *peVar7;
  ClientContext *pCVar8;
  DatabaseInstance *pDVar9;
  ColumnDefinition *this_00;
  ParserException *this_01;
  long *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *column_list_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  shared_ptr<duckdb::Relation,_true> sVar10;
  ParserOptions options_1;
  child_list_t<Value> column_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  files;
  ColumnList col_list;
  named_parameter_map_t options;
  undefined6 uStack_1de;
  string local_1c8;
  element_type *local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_198;
  string *local_190;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_188;
  string local_170;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  local_150;
  ColumnList local_f0;
  LogicalType local_80;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_188.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  column_list_00 = (string *)*in_RCX;
  local_190 = (string *)in_RCX[1];
  local_1a0 = (element_type *)this;
  local_198 = columns;
  if (column_list_00 != local_190) {
    do {
      pCVar8 = shared_ptr<duckdb::ClientContext,_true>::operator->
                         ((shared_ptr<duckdb::ClientContext,_true> *)csv_file);
      bVar2 = (pCVar8->config).preserve_identifier_case;
      bVar3 = (pCVar8->config).integer_division;
      iVar4 = (pCVar8->config).max_expression_depth;
      pDVar9 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&pCVar8->db);
      options_00.integer_division = bVar3;
      options_00.preserve_identifier_case = bVar2;
      options_00._2_6_ = uStack_1de;
      options_00.max_expression_depth = iVar4;
      options_00.extensions = &(pDVar9->config).parser_extensions;
      Parser::ParseColumnList(&local_f0,column_list_00,options_00);
      if ((long)local_f0.columns.
                super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_f0.columns.
                super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                ._M_impl.super__Vector_impl_data._M_start != 0xd8) {
        this_01 = (ParserException *)__cxa_allocate_exception(0x10);
        local_150.first._M_dataplus._M_p = (pointer)&local_150.first.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,"Expected a single column definition","");
        ParserException::ParserException(this_01,&local_150.first);
        __cxa_throw(this_01,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      this_00 = ColumnList::GetColumnMutable(&local_f0,(LogicalIndex)0x0);
      ColumnDefinition::GetName_abi_cxx11_(&local_1c8,this_00);
      ColumnDefinition::GetType(&local_80,this_00);
      LogicalType::ToString_abi_cxx11_(&local_170,&local_80);
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_150,&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
                ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                  *)&local_188,&local_150);
      Value::~Value(&local_150.second);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.first._M_dataplus._M_p != &local_150.first.field_2) {
        operator_delete(local_150.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      LogicalType::~LogicalType(&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      if (local_f0.physical_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.physical_columns.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_f0.name_map._M_h);
      ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
                ((vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *)
                 &local_f0);
      column_list_00 = column_list_00 + 1;
    } while (column_list_00 != local_190);
  }
  pCVar1 = (pointer)((long)&local_f0.columns.
                            super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                            .
                            super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                            ._M_impl.super__Vector_impl_data + 0x10);
  pbVar5 = (local_198->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f0.columns.super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
  .super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = pCVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pbVar5,
             (long)&(((local_198->
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p + (long)pbVar5)
  ;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_f0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_150,__l,(allocator_type *)&local_1c8);
  if (local_f0.columns.
      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      _M_impl.super__Vector_impl_data._M_start != pCVar1) {
    operator_delete(local_f0.columns.
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    .
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_f0.columns.super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
  .super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ReadCSVRelation,std::allocator<duckdb::ReadCSVRelation>,duckdb::shared_ptr<duckdb::ClientContext,true>&,duckdb::vector<std::__cxx11::string,true>&,std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_f0.columns.
                     super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                     .
                     super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                     ._M_impl.super__Vector_impl_data + 8),(ReadCSVRelation **)&local_f0,
             (allocator<duckdb::ReadCSVRelation> *)&local_170,
             (shared_ptr<duckdb::ClientContext,_true> *)csv_file,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)&local_150,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
              *)&local_68);
  shared_ptr<duckdb::ReadCSVRelation,_true>::shared_ptr
            ((shared_ptr<duckdb::ReadCSVRelation,_true> *)&local_1c8,
             (shared_ptr<duckdb::ReadCSVRelation> *)&local_f0);
  if (local_f0.columns.
      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_f0.columns.
               super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
               super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  peVar7 = local_1a0;
  sVar6 = local_1c8._M_string_length;
  (local_1a0->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_1c8._M_string_length = 0;
  (((shared_ptr<duckdb::ClientContext,_true> *)&local_1a0->_vptr_Relation)->internal).
  super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1c8._M_dataplus._M_p;
  (local_1a0->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar6;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_150);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_188);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  sVar10.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar10.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar10.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Connection::ReadCSV(const string &csv_file, const vector<string> &columns) {
	// parse columns
	named_parameter_map_t options;
	child_list_t<Value> column_list;
	for (auto &column : columns) {
		auto col_list = Parser::ParseColumnList(column, context->GetParserOptions());
		if (col_list.LogicalColumnCount() != 1) {
			throw ParserException("Expected a single column definition");
		}
		auto &col_def = col_list.GetColumnMutable(LogicalIndex(0));
		column_list.push_back({col_def.GetName(), col_def.GetType().ToString()});
	}
	vector<string> files {csv_file};
	return make_shared_ptr<ReadCSVRelation>(context, files, std::move(options));
}